

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

bool __thiscall
TPZMatrix<double>::SolveEigensystemJacobi
          (TPZMatrix<double> *this,int64_t *numiterations,REAL *tol,TPZVec<double> *Eigenvalues,
          TPZFMatrix<double> *Eigenvectors)

{
  double dVar1;
  long lVar2;
  ulong row;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  double *pdVar7;
  int64_t i;
  long lVar8;
  int64_t j;
  ulong uVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  double dVar10;
  TPZFNMatrix<3,_double> VecIni;
  TPZFNMatrix<9,_double> Matrix;
  TPZFNMatrix<3,_double> VecIni_cp;
  double local_478;
  double local_458;
  TPZFNMatrix<3,_double> local_3e0;
  TPZFMatrix<double> local_330;
  double local_2a0 [10];
  TPZFMatrix<double> local_250;
  double local_1c0 [10];
  TPZFNMatrix<3,_double> local_170;
  TPZFMatrix<double> local_c0;
  
  lVar2 = *numiterations;
  dVar1 = *tol;
  row = (this->super_TPZBaseMatrix).fRow;
  local_250.fElem = local_1c0;
  local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0183dbe0;
  local_250.fSize = 9;
  local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = row;
  local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = row;
  local_250.fGiven = local_250.fElem;
  TPZVec<int>::TPZVec(&local_250.fPivot.super_TPZVec<int>,0);
  local_250.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_250.fPivot.super_TPZVec<int>.fStore = local_250.fPivot.fExtAlloc;
  local_250.fPivot.super_TPZVec<int>.fNElements = 0;
  local_250.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_250.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_250.fWork.fStore = (double *)0x0;
  local_250.fWork.fNElements = 0;
  local_250.fWork.fNAlloc = 0;
  pdVar7 = (double *)0x0;
  if ((row != 0) && (uVar6 = row * row, pdVar7 = local_250.fElem, 9 < uVar6)) {
    pdVar7 = (double *)operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
  }
  local_250.fElem = pdVar7;
  local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
  if (0 < (long)row) {
    uVar6 = 0;
    do {
      uVar9 = 0;
      do {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,uVar6,uVar9);
        if ((local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar6) ||
           (local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar9)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_250.fElem[local_250.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar9 + uVar6]
             = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        uVar9 = uVar9 + 1;
      } while (row != uVar9);
      uVar6 = uVar6 + 1;
    } while (uVar6 != row);
  }
  bVar4 = SolveEigenvaluesJacobi(&local_250.super_TPZMatrix<double>,numiterations,tol,Eigenvalues);
  if (bVar4) {
    local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)0x0;
    TPZFNMatrix<3,_double>::TPZFNMatrix(&local_3e0,row,1,(double *)&local_330);
    local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)0x0;
    TPZFNMatrix<3,_double>::TPZFNMatrix(&local_170,row,1,(double *)&local_330);
    (*(Eigenvectors->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(Eigenvectors,row,row);
    (*(Eigenvectors->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xf])(Eigenvectors);
    if (0 < (long)row) {
      uVar6 = 0;
      do {
        uVar9 = 0;
        do {
          iVar5 = rand();
          local_3e0.super_TPZFMatrix<double>.fElem[uVar9] = (double)iVar5;
          uVar9 = uVar9 + 1;
        } while (row != uVar9);
        TPZFMatrix<double>::TPZFMatrix(&local_c0,this);
        local_330.fElem = local_2a0;
        local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
        local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
        local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
        local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
        local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZFMatrix_0183dbe0;
        local_330.fSize = 9;
        local_330.fGiven = local_330.fElem;
        TPZVec<int>::TPZVec(&local_330.fPivot.super_TPZVec<int>,0);
        local_330.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
        local_330.fPivot.super_TPZVec<int>.fStore = local_330.fPivot.fExtAlloc;
        local_330.fPivot.super_TPZVec<int>.fNElements = 0;
        local_330.fPivot.super_TPZVec<int>.fNAlloc = 0;
        local_330.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
        local_330.fWork.fNAlloc = 0;
        local_330.fWork.fStore = (double *)0x0;
        local_330.fWork.fNElements = 0;
        local_330.fElem = (double *)0x0;
        local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZFNMatrix_0183d8f0;
        TPZFMatrix<double>::operator=(&local_330,&local_c0);
        TPZFMatrix<double>::~TPZFMatrix(&local_c0);
        dVar10 = ReturnNearestValue(Eigenvalues->fStore[uVar6],Eigenvalues,1e-05);
        dVar10 = ABS(dVar10 - Eigenvalues->fStore[uVar6]);
        if (dVar10 <= 1e-05) {
          uVar9 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar9,uVar9)
            ;
            local_330.fElem
            [(uVar9 & 0xffffffff) * local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow +
             uVar9] = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01) -
                      (Eigenvalues->fStore[uVar6] + -0.01);
            uVar9 = uVar9 + 1;
          } while (row != uVar9);
        }
        else {
          uVar9 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar9,uVar9)
            ;
            local_330.fElem
            [(uVar9 & 0xffffffff) * local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow +
             uVar9] = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) -
                      (dVar10 * -0.01 + Eigenvalues->fStore[uVar6]);
            uVar9 = uVar9 + 1;
          } while (row != uVar9);
        }
        local_478 = 0.0;
        uVar9 = 0;
        do {
          if ((local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
               <= (long)uVar9) ||
             (local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <
              1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
               <= (long)uVar9) ||
             (local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <
              1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_478 = local_478 +
                      ABS(local_3e0.super_TPZFMatrix<double>.fElem[uVar9]) *
                      ABS(local_3e0.super_TPZFMatrix<double>.fElem[uVar9]);
          uVar9 = uVar9 + 1;
        } while (row != uVar9);
        if (local_478 < 0.0) {
          local_478 = sqrt(local_478);
        }
        else {
          local_478 = SQRT(local_478);
        }
        uVar9 = 0;
        do {
          if ((local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
               <= (long)uVar9) ||
             (local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <
              1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
               <= (long)uVar9) ||
             (local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <
              1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_3e0.super_TPZFMatrix<double>.fElem[uVar9] =
               local_3e0.super_TPZFMatrix<double>.fElem[uVar9] / local_478;
          uVar9 = uVar9 + 1;
        } while (row != uVar9);
        if (-1 < lVar2 && dVar1 < 10.0) {
          lVar8 = 0;
          do {
            uVar9 = 0;
            do {
              if ((local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                   fRow <= (long)uVar9) ||
                 (local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                  fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_170.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                   fRow <= (long)uVar9) ||
                 (local_170.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                  fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_170.super_TPZFMatrix<double>.fElem[uVar9] =
                   local_3e0.super_TPZFMatrix<double>.fElem[uVar9];
              uVar9 = uVar9 + 1;
            } while (row != uVar9);
            iVar5 = (*local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x10])(&local_330);
            if (iVar5 != 0) {
              Error("LU decomposition is not a symmetric decomposition",(char *)0x0);
            }
            iVar5 = (*local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x17])(&local_330);
            if (iVar5 != 0) {
              (*local_330.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x43])(&local_330);
            }
            local_478 = 0.0;
            uVar9 = 0;
            do {
              if ((local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                   fRow <= (long)uVar9) ||
                 (local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                  fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                   fRow <= (long)uVar9) ||
                 (local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                  fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_478 = local_478 +
                          ABS(local_3e0.super_TPZFMatrix<double>.fElem[uVar9]) *
                          ABS(local_3e0.super_TPZFMatrix<double>.fElem[uVar9]);
              uVar9 = uVar9 + 1;
            } while (row != uVar9);
            if (local_478 < 0.0) {
              local_478 = sqrt(local_478);
            }
            else {
              local_478 = SQRT(local_478);
            }
            local_458 = 0.0;
            uVar9 = 0;
            do {
              if ((local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                   fRow <= (long)uVar9) ||
                 (local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                  fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                   fRow <= (long)uVar9) ||
                 (local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                  fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_3e0.super_TPZFMatrix<double>.fElem[uVar9] =
                   local_3e0.super_TPZFMatrix<double>.fElem[uVar9] / local_478;
              if ((local_170.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                   fRow <= (long)uVar9) ||
                 (local_170.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                  fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                   fRow <= (long)uVar9) ||
                 (local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                  fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_170.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                   fRow <= (long)uVar9) ||
                 (local_170.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                  fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                   fRow <= (long)uVar9) ||
                 (local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
                  fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_458 = local_458 +
                          ABS((local_170.super_TPZFMatrix<double>.fElem[uVar9] -
                              local_3e0.super_TPZFMatrix<double>.fElem[uVar9]) *
                              (local_170.super_TPZFMatrix<double>.fElem[uVar9] -
                              local_3e0.super_TPZFMatrix<double>.fElem[uVar9]));
              uVar9 = uVar9 + 1;
            } while (row != uVar9);
            if (local_458 < 0.0) {
              local_458 = sqrt(local_458);
            }
            else {
              local_458 = SQRT(local_458);
            }
          } while ((dVar1 < local_458) && (bVar3 = lVar8 < lVar2, lVar8 = lVar8 + 1, bVar3));
        }
        uVar9 = 0;
        do {
          if ((local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow
               <= (long)uVar9) ||
             (local_3e0.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <
              1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((Eigenvectors->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)uVar6) ||
             ((Eigenvectors->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar9)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          Eigenvectors->fElem
          [(Eigenvectors->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * uVar9 + uVar6] =
               (double)(~-(ulong)(ABS(local_3e0.super_TPZFMatrix<double>.fElem[uVar9]) < 1e-05) &
                       (ulong)local_3e0.super_TPZFMatrix<double>.fElem[uVar9]);
          uVar9 = uVar9 + 1;
        } while (row != uVar9);
        TPZFMatrix<double>::~TPZFMatrix(&local_330,&PTR_PTR_0183dba8);
        uVar6 = uVar6 + 1;
      } while (uVar6 != row);
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_170.super_TPZFMatrix<double>,&PTR_PTR_0186cdf0);
    TPZFMatrix<double>::~TPZFMatrix(&local_3e0.super_TPZFMatrix<double>,&PTR_PTR_0186cdf0);
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_250,&PTR_PTR_0183dba8);
  return bVar4;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}